

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hh
# Opt level: O0

void __thiscall SatLookAngles::updateTimeAndPositions(SatLookAngles *this)

{
  bool bVar1;
  DateTime DVar2;
  reference tle;
  CoordTopocentric local_370;
  undefined1 local_350 [8];
  Eci pos;
  SGP4 model;
  pair<Tle,_CoordTopocentric> *sat;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
  *__range1;
  SatLookAngles *this_local;
  
  DVar2 = DateTime::Now(true);
  (this->_time).m_encoded = DVar2.m_encoded;
  __end1 = std::
           vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
           ::begin(&this->_sats);
  sat = (pair<Tle,_CoordTopocentric> *)
        std::
        vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
        ::end(&this->_sats);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<Tle,_CoordTopocentric>_*,_std::vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>_>
                                *)&sat);
    if (!bVar1) break;
    tle = __gnu_cxx::
          __normal_iterator<std::pair<Tle,_CoordTopocentric>_*,_std::vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>_>
          ::operator*(&__end1);
    SGP4::SGP4((SGP4 *)&pos.m_velocity.w,&tle->first);
    SGP4::FindPosition((Eci *)local_350,(SGP4 *)&pos.m_velocity.w,&this->_time);
    Observer::GetLookAngle(&local_370,&this->_me,(Eci *)local_350);
    CoordTopocentric::operator=(&tle->second,&local_370);
    __gnu_cxx::
    __normal_iterator<std::pair<Tle,_CoordTopocentric>_*,_std::vector<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void updateTimeAndPositions() {
    _time = DateTime::Now(true);
    for (auto &sat : _sats) {
      const auto model = SGP4(sat.first);
      const auto pos = model.FindPosition(_time);
      sat.second = _me.GetLookAngle(pos);
    }
  }